

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O2

void opengv::relative_pose::modules::fivept_kneip::sPolynomial55
               (Matrix<double,_66,_197,_0,_66,_197> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  
  dVar1 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
          m_storage.m_data.array[0x29a8];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xa03] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x29ea] / dVar1;
  dVar2 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
          m_storage.m_data.array[0x29eb];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1285] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2bfb] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x12c7] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2c3d] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x134b] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2cc1] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x138d] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2d03] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x13cf] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2bfa] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1411] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2c3c] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1495] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2cc0] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x14d7] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2d02] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1663] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2d87] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x16a5] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2d86] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1831] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2dc9] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1873] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2dc8] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1bcd] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2e0b] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1c0f] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2e4d] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1c51] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2e8f] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1c93] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2ed1] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1cd5] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2f13] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1d17] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2e0a] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1d59] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2e4c] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1d9b] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2e8e] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1ddd] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2ed0] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1e1f] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2f12] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2f55] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1e61] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2f54] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1fab] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2f97] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1fed] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2f96] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2179] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2fd9] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x21bb] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2fd8] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2389] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x301b] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x23cb] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x301a] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2767] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x305d] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x27a9] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x309f] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x27eb] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x30e1] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x282d] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x3123] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x286f] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x3165] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x28b1] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x305c] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x28f3] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x309e] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2935] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x30e0] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2977] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3122] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x29b9] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x3164] / dVar1 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x31a7] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x29fb] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x31a6] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2b45] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x31e9] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2b87] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x31e8] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2d13] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x322b] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2d55] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x322a] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2f23] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x326d] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2f65] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x326c] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x3175] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x32af] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x31b7] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x32ae] / dVar1;
  return;
}

Assistant:

void
opengv::relative_pose::modules::fivept_kneip::sPolynomial55( Eigen::Matrix<double,66,197> & groebnerMatrix )
{
  groebnerMatrix(55,38) = groebnerMatrix(38,162)/(groebnerMatrix(38,161));
  groebnerMatrix(55,71) = -groebnerMatrix(39,170)/(groebnerMatrix(39,162));
  groebnerMatrix(55,72) = -groebnerMatrix(39,171)/(groebnerMatrix(39,162));
  groebnerMatrix(55,74) = -groebnerMatrix(39,173)/(groebnerMatrix(39,162));
  groebnerMatrix(55,75) = -groebnerMatrix(39,174)/(groebnerMatrix(39,162));
  groebnerMatrix(55,76) = groebnerMatrix(38,170)/(groebnerMatrix(38,161));
  groebnerMatrix(55,77) = groebnerMatrix(38,171)/(groebnerMatrix(38,161));
  groebnerMatrix(55,79) = groebnerMatrix(38,173)/(groebnerMatrix(38,161));
  groebnerMatrix(55,80) = groebnerMatrix(38,174)/(groebnerMatrix(38,161));
  groebnerMatrix(55,86) = -groebnerMatrix(39,176)/(groebnerMatrix(39,162));
  groebnerMatrix(55,87) = groebnerMatrix(38,176)/(groebnerMatrix(38,161));
  groebnerMatrix(55,93) = -groebnerMatrix(39,177)/(groebnerMatrix(39,162));
  groebnerMatrix(55,94) = groebnerMatrix(38,177)/(groebnerMatrix(38,161));
  groebnerMatrix(55,107) = -groebnerMatrix(39,178)/(groebnerMatrix(39,162));
  groebnerMatrix(55,108) = -groebnerMatrix(39,179)/(groebnerMatrix(39,162));
  groebnerMatrix(55,109) = -groebnerMatrix(39,180)/(groebnerMatrix(39,162));
  groebnerMatrix(55,110) = -groebnerMatrix(39,181)/(groebnerMatrix(39,162));
  groebnerMatrix(55,111) = -groebnerMatrix(39,182)/(groebnerMatrix(39,162));
  groebnerMatrix(55,112) = groebnerMatrix(38,178)/(groebnerMatrix(38,161));
  groebnerMatrix(55,113) = groebnerMatrix(38,179)/(groebnerMatrix(38,161));
  groebnerMatrix(55,114) = groebnerMatrix(38,180)/(groebnerMatrix(38,161));
  groebnerMatrix(55,115) = groebnerMatrix(38,181)/(groebnerMatrix(38,161));
  groebnerMatrix(55,116) = (groebnerMatrix(38,182)/(groebnerMatrix(38,161))-groebnerMatrix(39,183)/(groebnerMatrix(39,162)));
  groebnerMatrix(55,117) = groebnerMatrix(38,183)/(groebnerMatrix(38,161));
  groebnerMatrix(55,122) = -groebnerMatrix(39,184)/(groebnerMatrix(39,162));
  groebnerMatrix(55,123) = groebnerMatrix(38,184)/(groebnerMatrix(38,161));
  groebnerMatrix(55,129) = -groebnerMatrix(39,185)/(groebnerMatrix(39,162));
  groebnerMatrix(55,130) = groebnerMatrix(38,185)/(groebnerMatrix(38,161));
  groebnerMatrix(55,137) = -groebnerMatrix(39,186)/(groebnerMatrix(39,162));
  groebnerMatrix(55,138) = groebnerMatrix(38,186)/(groebnerMatrix(38,161));
  groebnerMatrix(55,152) = -groebnerMatrix(39,187)/(groebnerMatrix(39,162));
  groebnerMatrix(55,153) = -groebnerMatrix(39,188)/(groebnerMatrix(39,162));
  groebnerMatrix(55,154) = -groebnerMatrix(39,189)/(groebnerMatrix(39,162));
  groebnerMatrix(55,155) = -groebnerMatrix(39,190)/(groebnerMatrix(39,162));
  groebnerMatrix(55,156) = -groebnerMatrix(39,191)/(groebnerMatrix(39,162));
  groebnerMatrix(55,157) = groebnerMatrix(38,187)/(groebnerMatrix(38,161));
  groebnerMatrix(55,158) = groebnerMatrix(38,188)/(groebnerMatrix(38,161));
  groebnerMatrix(55,159) = groebnerMatrix(38,189)/(groebnerMatrix(38,161));
  groebnerMatrix(55,160) = groebnerMatrix(38,190)/(groebnerMatrix(38,161));
  groebnerMatrix(55,161) = (groebnerMatrix(38,191)/(groebnerMatrix(38,161))-groebnerMatrix(39,192)/(groebnerMatrix(39,162)));
  groebnerMatrix(55,162) = groebnerMatrix(38,192)/(groebnerMatrix(38,161));
  groebnerMatrix(55,167) = -groebnerMatrix(39,193)/(groebnerMatrix(39,162));
  groebnerMatrix(55,168) = groebnerMatrix(38,193)/(groebnerMatrix(38,161));
  groebnerMatrix(55,174) = -groebnerMatrix(39,194)/(groebnerMatrix(39,162));
  groebnerMatrix(55,175) = groebnerMatrix(38,194)/(groebnerMatrix(38,161));
  groebnerMatrix(55,182) = -groebnerMatrix(39,195)/(groebnerMatrix(39,162));
  groebnerMatrix(55,183) = groebnerMatrix(38,195)/(groebnerMatrix(38,161));
  groebnerMatrix(55,191) = -groebnerMatrix(39,196)/(groebnerMatrix(39,162));
  groebnerMatrix(55,192) = groebnerMatrix(38,196)/(groebnerMatrix(38,161));
}